

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_85(QPDF *pdf,char *arg2)

{
  char cVar1;
  bool b;
  string s;
  uint ui;
  int i;
  double num;
  unsigned_long_long uli;
  QPDFObjectHandle oh_r;
  QPDFObjectHandle oh_i;
  QPDFObjectHandle oh_b;
  longlong li;
  QPDFObjectHandle oh_s;
  QPDFObjectHandle oh_i_neg;
  QPDFObjectHandle oh_ii;
  QPDFObjectHandle oh_o;
  QPDFObjectHandle oh_n;
  QPDFObjectHandle oh_i_minminus;
  QPDFObjectHandle oh_i_umaxplus;
  QPDFObjectHandle oh_i_maxplus;
  long *local_100 [2];
  long local_f0 [5];
  string local_c8 [16];
  undefined1 local_b8 [16];
  bool local_a8 [24];
  string local_90 [16];
  undefined1 local_80 [16];
  string local_70 [16];
  string local_60 [16];
  string local_50 [16];
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  undefined1 local_20 [16];
  
  QPDFObjectHandle::newBool(SUB81(local_a8,0));
  QPDFObjectHandle::newInteger((longlong)local_b8);
  QPDFObjectHandle::newInteger((longlong)local_20);
  QPDFObjectHandle::newInteger((longlong)local_30);
  QPDFObjectHandle::newInteger((longlong)local_40);
  QPDFObjectHandle::newInteger((longlong)local_80);
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"42.0","");
  QPDFObjectHandle::newReal(local_c8);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"/Test","");
  QPDFObjectHandle::newName(local_50);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"/Test","");
  QPDFObjectHandle::newString(local_90);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"/Test","");
  QPDFObjectHandle::newOperator(local_60);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"/Test","");
  QPDFObjectHandle::newInlineImage(local_70);
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  cVar1 = QPDFObjectHandle::getValueAsBool(local_a8);
  if (cVar1 != '\0') {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xbc3,"void test_85(QPDF &, const char *)");
  }
  __assert_fail("oh_b.getValueAsBool(b)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xbc2,"void test_85(QPDF &, const char *)");
}

Assistant:

static void
test_85(QPDF& pdf, char const* arg2)
{
    // Test QPDFObjectHandle::getValueAs... accessors

    auto oh_b = QPDFObjectHandle::newBool(false);
    auto oh_i = QPDFObjectHandle::newInteger(1);
    auto oh_i_maxplus = QPDFObjectHandle::newInteger(QIntC::to_longlong(INT_MAX) + 1LL);
    auto oh_i_umaxplus = QPDFObjectHandle::newInteger(QIntC::to_longlong(UINT_MAX) + 1LL);
    auto oh_i_minminus = QPDFObjectHandle::newInteger(QIntC::to_longlong(INT_MIN) - 1LL);
    auto oh_i_neg = QPDFObjectHandle::newInteger(-1);
    auto oh_r = QPDFObjectHandle::newReal("42.0");
    auto oh_n = QPDFObjectHandle::newName("/Test");
    auto oh_s = QPDFObjectHandle::newString("/Test");
    auto oh_o = QPDFObjectHandle::newOperator("/Test");
    auto oh_ii = QPDFObjectHandle::newInlineImage("/Test");

    bool b = true;
    assert(oh_b.getValueAsBool(b));
    assert(!b);
    assert(!oh_i.getValueAsBool(b));
    assert(!b);
    long long li = 0LL;
    assert(oh_i.getValueAsInt(li));
    assert(li == 1LL);
    assert(!oh_b.getValueAsInt(li));
    assert(li == 1LL);
    int i = 0;
    assert(oh_i.getValueAsInt(i));
    assert(i == 1);
    assert(!oh_b.getValueAsInt(i));
    assert(i == 1);
    assert(oh_i_maxplus.getValueAsInt(i));
    assert(i == INT_MAX);
    assert(oh_i_minminus.getValueAsInt(i));
    assert(i == INT_MIN);
    unsigned long long uli = 0U;
    assert(oh_i.getValueAsUInt(uli));
    assert(uli == 1u);
    assert(!oh_b.getValueAsUInt(uli));
    assert(uli == 1u);
    assert(oh_i_neg.getValueAsUInt(uli));
    assert(uli == 0u);
    unsigned int ui = 0U;
    assert(oh_i.getValueAsUInt(ui));
    assert(ui == 1u);
    assert(!oh_b.getValueAsUInt(ui));
    assert(ui == 1u);
    assert(oh_i_neg.getValueAsUInt(ui));
    assert(ui == 0u);
    assert(oh_i_umaxplus.getValueAsUInt(ui));
    assert(ui == UINT_MAX);
    std::string s = "0";
    assert(oh_r.getValueAsReal(s));
    assert(s == "42.0");
    assert(!oh_i.getValueAsReal(s));
    assert(s == "42.0");
    double num = 0.0;
    assert(oh_i.getValueAsNumber(num));
    assert(((num - 1.0) < 1e-6) && (num - 1.0 > -1e-6));
    assert(oh_r.getValueAsNumber(num));
    assert(((num - 42.0) < 1e-6) && (num - 42.0 > -1e-6));
    assert(!oh_b.getValueAsNumber(num));
    assert(((num - 42.0) < 1e-6) && (num - 42.0 > -1e-6));
    s = "";
    assert(oh_n.getValueAsName(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsName(s));
    assert(s == "/Test");
    s = "";
    assert(oh_s.getValueAsUTF8(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsUTF8(s));
    assert(s == "/Test");
    s = "";
    assert(oh_s.getValueAsUTF8(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsUTF8(s));
    assert(s == "/Test");
    s = "";
    assert(oh_o.getValueAsOperator(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsOperator(s));
    assert(s == "/Test");
    s = "";
    assert(oh_ii.getValueAsInlineImage(s));
    assert(s == "/Test");
    assert(!oh_r.getValueAsInlineImage(s));
    assert(s == "/Test");
}